

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_diag.c
# Opt level: O3

int CVDiagGetLastFlag(void *cvode_mem,long *flag)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar1 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    line = 0xf3;
  }
  else {
    if (*(long *)((long)cvode_mem + 0x410) != 0) {
      *flag = *(long *)(*(long *)((long)cvode_mem + 0x410) + 0x28);
      return 0;
    }
    msgfmt = "CVDIAG memory is NULL.";
    iVar1 = -2;
    error_code = -2;
    line = 0xfb;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVDiagGetLastFlag",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_diag.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVDiagGetLastFlag(void* cvode_mem, long int* flag)
{
  CVodeMem cv_mem;
  CVDiagMem cvdiag_mem;

  /* Return immediately if cvode_mem is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVDIAG_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGDG_CVMEM_NULL);
    return (CVDIAG_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (lmem == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGDG_LMEM_NULL);
    return (CVDIAG_LMEM_NULL);
  }
  cvdiag_mem = (CVDiagMem)lmem;

  *flag = last_flag;

  return (CVDIAG_SUCCESS);
}